

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::InvalidError::~InvalidError(InvalidError *this)

{
  void *in_RDI;
  
  ~InvalidError((InvalidError *)0x155598);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

explicit InvalidError(std::string name)
        : InvalidError(name + ": Too many positional arguments with unlimited expected args", ExitCodes::InvalidError) {
    }